

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_23dc62::check<float>(istream *is,float c)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  float in_XMM0_Da;
  float v;
  float *in_stack_ffffffffffffffe8;
  float in_stack_fffffffffffffff0;
  
  Imf_3_2::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  pcVar1 = std::type_info::name((type_info *)&float::typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,": expected ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_XMM0_Da);
  poVar2 = std::operator<<(poVar2,", got ");
  this = (void *)std::ostream::operator<<(poVar2,in_stack_fffffffffffffff0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  if ((in_XMM0_Da == in_stack_fffffffffffffff0) &&
     (!NAN(in_XMM0_Da) && !NAN(in_stack_fffffffffffffff0))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = float]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}